

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O0

Var Js::JavascriptMath::Divide_Full(Var aLeft,Var aRight,ScriptContext *scriptContext)

{
  bool bVar1;
  double value;
  ScriptContext *scriptContext_local;
  Var aRight_local;
  Var aLeft_local;
  
  bVar1 = TaggedInt::IsPair(aLeft,aRight);
  if (bVar1) {
    aLeft_local = TaggedInt::Divide(aLeft,aRight,scriptContext);
  }
  else {
    value = Divide_Helper(aLeft,aRight,scriptContext);
    aLeft_local = JavascriptNumber::NewInlined(value,scriptContext);
  }
  return aLeft_local;
}

Assistant:

Var JavascriptMath::Divide_Full(Var aLeft,Var aRight, ScriptContext* scriptContext)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_Divide_Full);
            // If both arguments are TaggedInt, then try to do integer division
            // This case is not handled by the lowerer.
            if (TaggedInt::IsPair(aLeft, aRight))
            {
                return TaggedInt::Divide(aLeft, aRight, scriptContext);
            }

            return JavascriptNumber::NewInlined( Divide_Helper(aLeft, aRight, scriptContext), scriptContext );
            JIT_HELPER_END(Op_Divide_Full);
        }